

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataModel.cpp
# Opt level: O2

bool __thiscall Rml::DataModel::BindVariable(DataModel *this,String *name,DataVariable variable)

{
  char *pcVar1;
  pointer pcVar2;
  DataVariable variable_local;
  pair<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataVariable,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
  local_30;
  
  variable_local.ptr = variable.ptr;
  variable_local.definition = variable.definition;
  pcVar1 = LegalVariableName(name);
  if (pcVar1 == (char *)0x0) {
    if (variable.definition == (VariableDefinition *)0x0) {
      pcVar2 = (name->_M_dataplus)._M_p;
      pcVar1 = "Could not bind variable \'%s\' to data model, data type not registered.";
    }
    else {
      robin_hood::detail::
      Table<true,80ul,std::__cxx11::string,Rml::DataVariable,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
      ::emplace<std::__cxx11::string_const&,Rml::DataVariable&>
                (&local_30,
                 (Table<true,80ul,std::__cxx11::string,Rml::DataVariable,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                  *)&this->variables,name,&variable_local);
      if (local_30.second != false) {
        return true;
      }
      pcVar2 = (name->_M_dataplus)._M_p;
      pcVar1 = "Data model variable with name \'%s\' already exists.";
    }
    Log::Message(LT_WARNING,pcVar1,pcVar2);
  }
  else {
    Log::Message(LT_WARNING,"Could not bind data variable \'%s\'. %s",(name->_M_dataplus)._M_p,
                 pcVar1);
  }
  return false;
}

Assistant:

bool DataModel::BindVariable(const String& name, DataVariable variable)
{
	const char* name_error_str = LegalVariableName(name);
	if (name_error_str)
	{
		Log::Message(Log::LT_WARNING, "Could not bind data variable '%s'. %s", name.c_str(), name_error_str);
		return false;
	}

	if (!variable)
	{
		Log::Message(Log::LT_WARNING, "Could not bind variable '%s' to data model, data type not registered.", name.c_str());
		return false;
	}

	bool inserted = variables.emplace(name, variable).second;
	if (!inserted)
	{
		Log::Message(Log::LT_WARNING, "Data model variable with name '%s' already exists.", name.c_str());
		return false;
	}

	return true;
}